

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Abc_Obj_t * Abc_NodeFromMap_rec(Abc_Ntk_t *pNtkNew,Map_Node_t *pNodeMap,int fPhase)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Map_Cut_t *pMVar3;
  Abc_Obj_t *pFanin;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar4;
  
  iVar1 = Map_NodeIsConst(pNodeMap);
  if (iVar1 == 0) {
    pAVar2 = (Abc_Obj_t *)Map_NodeReadData(pNodeMap,fPhase);
    if (pAVar2 == (Abc_Obj_t *)0x0) {
      pMVar3 = Map_NodeReadCutBest(pNodeMap,fPhase);
      if (pMVar3 != (Map_Cut_t *)0x0) {
        pAVar2 = Abc_NodeFromMapPhase_rec(pNtkNew,pNodeMap,fPhase);
        return pAVar2;
      }
      pMVar3 = Map_NodeReadCutBest(pNodeMap,(uint)(fPhase == 0));
      if (pMVar3 == (Map_Cut_t *)0x0) {
        iVar1 = Map_NodeIsConst(pNodeMap);
        if (iVar1 == 0) {
          __assert_fail("Map_NodeReadCutBest(pNodeMap, !fPhase) != NULL || Map_NodeIsConst(pNodeMap)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                        ,0x1cb,"Abc_Obj_t *Abc_NodeFromMap_rec(Abc_Ntk_t *, Map_Node_t *, int)");
        }
      }
      pFanin = Abc_NodeFromMapPhase_rec(pNtkNew,pNodeMap,(uint)(fPhase == 0));
      pAVar2 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
      Abc_ObjAddFanin(pAVar2,pFanin);
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pMVar4 = Mio_LibraryReadInv(pLib);
      (pAVar2->field_5).pData = pMVar4;
      Map_NodeSetData(pNodeMap,fPhase,(char *)pAVar2);
    }
  }
  else {
    if (fPhase == 0) {
      pAVar2 = Abc_NtkCreateNodeConst0(pNtkNew);
    }
    else {
      pAVar2 = Abc_NtkCreateNodeConst1(pNtkNew);
    }
    if ((pAVar2->field_5).pData == (void *)0x0) {
      printf("Error creating mapped network: Library does not have a constant %d gate.\n",
             (ulong)(uint)fPhase);
    }
  }
  return pAVar2;
}

Assistant:

Abc_Obj_t * Abc_NodeFromMap_rec( Abc_Ntk_t * pNtkNew, Map_Node_t * pNodeMap, int fPhase )
{
    Abc_Obj_t * pNodeNew, * pNodeInv;

    // check the case of constant node
    if ( Map_NodeIsConst(pNodeMap) )
    {
        pNodeNew = fPhase? Abc_NtkCreateNodeConst1(pNtkNew) : Abc_NtkCreateNodeConst0(pNtkNew);
        if ( pNodeNew->pData == NULL )
            printf( "Error creating mapped network: Library does not have a constant %d gate.\n", fPhase );
        return pNodeNew;
    }

    // check if the phase is already implemented
    pNodeNew = (Abc_Obj_t *)Map_NodeReadData( pNodeMap, fPhase );
    if ( pNodeNew )
        return pNodeNew;

    // implement the node if the best cut is assigned
    if ( Map_NodeReadCutBest(pNodeMap, fPhase) != NULL )
        return Abc_NodeFromMapPhase_rec( pNtkNew, pNodeMap, fPhase );

    // if the cut is not assigned, implement the node
    assert( Map_NodeReadCutBest(pNodeMap, !fPhase) != NULL || Map_NodeIsConst(pNodeMap) );
    pNodeNew = Abc_NodeFromMapPhase_rec( pNtkNew, pNodeMap, !fPhase );

    // add the inverter
    pNodeInv = Abc_NtkCreateNode( pNtkNew );
    Abc_ObjAddFanin( pNodeInv, pNodeNew );
    pNodeInv->pData = Mio_LibraryReadInv((Mio_Library_t *)Abc_FrameReadLibGen());

    // set the inverter
    Map_NodeSetData( pNodeMap, fPhase, (char *)pNodeInv );
    return pNodeInv;
}